

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::clearWorkspace(Compiler *this)

{
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex);
  Impl::clearWorkspace((this->impl).value.ptr);
  if (this_00 != (MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)0x0) {
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

void Compiler::clearWorkspace() const {
  impl.lockExclusive()->get()->clearWorkspace();
}